

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTable.cpp
# Opt level: O3

void __thiscall UnitTest_table4::UnitTest_table4(UnitTest_table4 *this)

{
  UnitTestBase::UnitTestBase(&this->super_UnitTestBase);
  (this->super_UnitTestBase)._vptr_UnitTestBase = (_func_int **)&PTR_Run_00187710;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_UnitTestBase).test_name_,0,
             (char *)(this->super_UnitTestBase).test_name_._M_string_length,0x16885a);
  return;
}

Assistant:

TEST_CASE(table4)
{
    luna::Table t;
    luna::Value key;
    luna::Value value;

    value.type_ = luna::ValueT_Number;

    for (int i = 0; i < 3; ++i)
    {
        value.num_ = i + 1;
        t.InsertArrayValue(i + 1, value);
    }

    value.num_ = 0;
    t.InsertArrayValue(1, value);

    EXPECT_TRUE(t.ArraySize() == 4);

    key.type_ = luna::ValueT_Number;
    for (int i = 0; i < 4; ++i)
    {
        key.num_ = i + 1;
        value = t.GetValue(key);
        EXPECT_TRUE(value.type_ == luna::ValueT_Number);
        EXPECT_TRUE(value.num_ == i);
    }
}